

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

void __thiscall
QtMWidgets::NavigationBarPrivate::NavigationBarPrivate
          (NavigationBarPrivate *this,NavigationBar *parent)

{
  NavigationBar *parent_local;
  NavigationBarPrivate *this_local;
  
  this->q = parent;
  this->stack = (QStackedWidget *)0x0;
  QList<QSharedPointer<QtMWidgets::NavigationItem>_>::QList(&this->rootItems);
  QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::QMap(&this->itemsMap);
  this->left = (NavigationButton *)0x0;
  this->right = (NavigationButton *)0x0;
  this->title = (TextLabel *)0x0;
  this->grid = (QGridLayout *)0x0;
  QStack<int>::QStack(&this->backStack);
  QStack<int>::QStack(&this->forwardStack);
  return;
}

Assistant:

NavigationBarPrivate( NavigationBar * parent )
		:	q( parent )
		,	stack( 0 )
		,	left( 0 )
		,	right( 0 )
		,	title( 0 )
		,	grid( 0 )
	{
	}